

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

Node * __thiscall
TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_>::NewKey
          (TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_> *this,
          int key)

{
  Node *pNVar1;
  char *pcVar2;
  undefined4 uVar3;
  int iVar4;
  undefined4 uVar5;
  Node *pNVar6;
  Node *pNVar7;
  Node *pNVar8;
  Node *pNVar9;
  hash_t hVar10;
  uint uVar11;
  uint uVar12;
  
  pNVar7 = this->Nodes;
  hVar10 = this->Size;
  do {
    uVar12 = hVar10 - 1 & key;
    pNVar1 = pNVar7 + uVar12;
    pNVar6 = pNVar1->Next;
    if (pNVar6 == (Node *)0x1) {
LAB_0045c804:
      pNVar9 = (Node *)0x0;
      pNVar7 = pNVar1;
LAB_0045c809:
      pNVar1->Next = pNVar9;
      this->NumUsed = this->NumUsed + 1;
      (pNVar7->Pair).Key = key;
      return pNVar7;
    }
    pNVar9 = this->LastFree;
    while (pNVar8 = pNVar9, pNVar9 = pNVar8 + -1, pNVar7 < pNVar8) {
      if (pNVar9->Next == (Node *)0x1) {
        this->LastFree = pNVar9;
        uVar11 = hVar10 - 1 & (pNVar1->Pair).Key;
        if (uVar11 != uVar12) {
          pNVar7 = pNVar7 + uVar11;
          do {
            pNVar6 = pNVar7;
            pNVar7 = pNVar6->Next;
          } while (pNVar7 != pNVar1);
          pNVar6->Next = pNVar9;
          uVar3 = *(undefined4 *)&(pNVar1->Pair).Value.field_0x14;
          pNVar8[-1].Pair.Value.linenum = (pNVar1->Pair).Value.linenum;
          *(undefined4 *)&pNVar8[-1].Pair.Value.field_0x14 = uVar3;
          pNVar7 = pNVar1->Next;
          iVar4 = (pNVar1->Pair).Key;
          uVar5 = *(undefined4 *)&(pNVar1->Pair).field_0x4;
          uVar3 = *(undefined4 *)&(pNVar1->Pair).Value.field_0x4;
          pcVar2 = (pNVar1->Pair).Value.filename.Chars;
          pNVar8[-1].Pair.Value.classname = (FName)(pNVar1->Pair).Value.classname.Index;
          *(undefined4 *)&pNVar8[-1].Pair.Value.field_0x4 = uVar3;
          pNVar8[-1].Pair.Value.filename.Chars = pcVar2;
          pNVar9->Next = pNVar7;
          pNVar8[-1].Pair.Key = iVar4;
          *(undefined4 *)&pNVar8[-1].Pair.field_0x4 = uVar5;
          goto LAB_0045c804;
        }
        pNVar9->Next = pNVar6;
        pNVar7 = pNVar9;
        goto LAB_0045c809;
      }
    }
    this->LastFree = pNVar9;
    Resize(this,hVar10 * 2);
    pNVar7 = this->Nodes;
    hVar10 = this->Size;
  } while( true );
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}